

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

InstanceArraySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::ConstantRange&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          span<const_slang::ast::Symbol_*,_18446744073709551615UL> *args_3,ConstantRange *args_4)

{
  SourceLocation SVar1;
  ConstantRange CVar2;
  size_t sVar3;
  char *pcVar4;
  pointer ppSVar5;
  size_t sVar6;
  InstanceArraySymbol *thisSym_;
  
  thisSym_ = (InstanceArraySymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InstanceArraySymbol *)this->endPtr < thisSym_ + 1) {
    thisSym_ = (InstanceArraySymbol *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(thisSym_ + 1);
  }
  sVar3 = args_1->_M_len;
  pcVar4 = args_1->_M_str;
  SVar1 = *args_2;
  ppSVar5 = args_3->_M_ptr;
  sVar6 = (args_3->_M_extent)._M_extent_value;
  CVar2 = *args_4;
  (thisSym_->super_Symbol).kind = InstanceArray;
  (thisSym_->super_Symbol).name._M_len = sVar3;
  (thisSym_->super_Symbol).name._M_str = pcVar4;
  (thisSym_->super_Symbol).location = SVar1;
  (thisSym_->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Symbol).parentScope = (Scope *)0x0;
  (thisSym_->super_Symbol).nextInScope = (Symbol *)0x0;
  (thisSym_->super_Symbol).indexInScope = 0;
  ast::Scope::Scope(&thisSym_->super_Scope,args,&thisSym_->super_Symbol);
  (thisSym_->elements)._M_ptr = ppSVar5;
  (thisSym_->elements)._M_extent._M_extent_value = sVar6;
  thisSym_->range = CVar2;
  return thisSym_;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }